

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prediction_scheme_decoder_factory.h
# Opt level: O0

unique_ptr<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>_>_>
 __thiscall
draco::MeshPredictionSchemeDecoderFactory<int>::
DispatchFunctor<draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>,_(draco::PredictionSchemeTransformType)1>
::operator()(DispatchFunctor<draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>,_(draco::PredictionSchemeTransformType)1>
             *this,PredictionSchemeMethod method,PointAttribute *attribute,
            PredictionSchemeWrapDecodingTransform<int,_int> *transform,
            MeshPredictionSchemeData<draco::CornerTable> *mesh_data,uint16_t bitstream_version)

{
  MeshPredictionSchemeData<draco::CornerTable> *pMVar1;
  PredictionSchemeWrapDecodingTransform<int,_int> *transform_00;
  unique_ptr<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>_>_>
  *this_00;
  int in_EDX;
  _Head_base<0UL,_draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>_*,_false>
  in_RDI;
  pointer in_stack_ffffffffffffff78;
  PredictionSchemeWrapDecodingTransform<int,_int> *in_stack_ffffffffffffff80;
  PointAttribute *in_stack_ffffffffffffff88;
  MeshPredictionSchemeParallelogramDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
  *in_stack_ffffffffffffff90;
  PointAttribute *in_stack_ffffffffffffff98;
  MeshPredictionSchemeTexCoordsPortableDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
  *in_stack_ffffffffffffffa0;
  PointAttribute *in_stack_ffffffffffffffa8;
  _Head_base<0UL,_draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>_*,_false>
  _Var2;
  
  if (in_EDX == 1) {
    operator_new(0x60);
    MeshPredictionSchemeParallelogramDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
    ::MeshPredictionSchemeParallelogramDecoder
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
               (MeshPredictionSchemeData<draco::CornerTable> *)in_stack_ffffffffffffff78);
    std::
    unique_ptr<draco::PredictionSchemeDecoder<int,draco::PredictionSchemeWrapDecodingTransform<int,int>>,std::default_delete<draco::PredictionSchemeDecoder<int,draco::PredictionSchemeWrapDecodingTransform<int,int>>>>
    ::
    unique_ptr<std::default_delete<draco::PredictionSchemeDecoder<int,draco::PredictionSchemeWrapDecodingTransform<int,int>>>,void>
              ((unique_ptr<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>_>_>
                *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  else if (in_EDX == 2) {
    operator_new(0x60);
    MeshPredictionSchemeMultiParallelogramDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
    ::MeshPredictionSchemeMultiParallelogramDecoder
              ((MeshPredictionSchemeMultiParallelogramDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
                *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
               (MeshPredictionSchemeData<draco::CornerTable> *)in_stack_ffffffffffffff78);
    std::
    unique_ptr<draco::PredictionSchemeDecoder<int,draco::PredictionSchemeWrapDecodingTransform<int,int>>,std::default_delete<draco::PredictionSchemeDecoder<int,draco::PredictionSchemeWrapDecodingTransform<int,int>>>>
    ::
    unique_ptr<std::default_delete<draco::PredictionSchemeDecoder<int,draco::PredictionSchemeWrapDecodingTransform<int,int>>>,void>
              ((unique_ptr<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>_>_>
                *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  else if (in_EDX == 4) {
    _Var2._M_head_impl = in_RDI._M_head_impl;
    pMVar1 = (MeshPredictionSchemeData<draco::CornerTable> *)operator_new(0x108);
    MeshPredictionSchemeConstrainedMultiParallelogramDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
    ::MeshPredictionSchemeConstrainedMultiParallelogramDecoder
              ((MeshPredictionSchemeConstrainedMultiParallelogramDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
                *)_Var2._M_head_impl,in_stack_ffffffffffffffa8,
               (PredictionSchemeWrapDecodingTransform<int,_int> *)in_stack_ffffffffffffffa0,pMVar1);
    std::
    unique_ptr<draco::PredictionSchemeDecoder<int,draco::PredictionSchemeWrapDecodingTransform<int,int>>,std::default_delete<draco::PredictionSchemeDecoder<int,draco::PredictionSchemeWrapDecodingTransform<int,int>>>>
    ::
    unique_ptr<std::default_delete<draco::PredictionSchemeDecoder<int,draco::PredictionSchemeWrapDecodingTransform<int,int>>>,void>
              ((unique_ptr<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>_>_>
                *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  else if (in_EDX == 3) {
    transform_00 = (PredictionSchemeWrapDecodingTransform<int,_int> *)operator_new(0xb0);
    MeshPredictionSchemeTexCoordsDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
    ::MeshPredictionSchemeTexCoordsDecoder
              ((MeshPredictionSchemeTexCoordsDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
                *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,transform_00,
               (MeshPredictionSchemeData<draco::CornerTable> *)in_stack_ffffffffffffff88,
               (int)((ulong)in_stack_ffffffffffffff80 >> 0x20));
    std::
    unique_ptr<draco::PredictionSchemeDecoder<int,draco::PredictionSchemeWrapDecodingTransform<int,int>>,std::default_delete<draco::PredictionSchemeDecoder<int,draco::PredictionSchemeWrapDecodingTransform<int,int>>>>
    ::
    unique_ptr<std::default_delete<draco::PredictionSchemeDecoder<int,draco::PredictionSchemeWrapDecodingTransform<int,int>>>,void>
              ((unique_ptr<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>_>_>
                *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  else if (in_EDX == 5) {
    pMVar1 = (MeshPredictionSchemeData<draco::CornerTable> *)operator_new(0xc0);
    MeshPredictionSchemeTexCoordsPortableDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
    ::MeshPredictionSchemeTexCoordsPortableDecoder
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
               (PredictionSchemeWrapDecodingTransform<int,_int> *)in_stack_ffffffffffffff90,pMVar1);
    std::
    unique_ptr<draco::PredictionSchemeDecoder<int,draco::PredictionSchemeWrapDecodingTransform<int,int>>,std::default_delete<draco::PredictionSchemeDecoder<int,draco::PredictionSchemeWrapDecodingTransform<int,int>>>>
    ::
    unique_ptr<std::default_delete<draco::PredictionSchemeDecoder<int,draco::PredictionSchemeWrapDecodingTransform<int,int>>>,void>
              ((unique_ptr<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>_>_>
                *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  else if (in_EDX == 6) {
    _Var2._M_head_impl = in_RDI._M_head_impl;
    this_00 = (unique_ptr<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>_>_>
               *)operator_new(0xd0);
    MeshPredictionSchemeGeometricNormalDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
    ::MeshPredictionSchemeGeometricNormalDecoder
              ((MeshPredictionSchemeGeometricNormalDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
                *)_Var2._M_head_impl,in_stack_ffffffffffffffa8,
               (PredictionSchemeWrapDecodingTransform<int,_int> *)in_stack_ffffffffffffffa0,
               (MeshPredictionSchemeData<draco::CornerTable> *)in_stack_ffffffffffffff98);
    std::
    unique_ptr<draco::PredictionSchemeDecoder<int,draco::PredictionSchemeWrapDecodingTransform<int,int>>,std::default_delete<draco::PredictionSchemeDecoder<int,draco::PredictionSchemeWrapDecodingTransform<int,int>>>>
    ::
    unique_ptr<std::default_delete<draco::PredictionSchemeDecoder<int,draco::PredictionSchemeWrapDecodingTransform<int,int>>>,void>
              (this_00,in_stack_ffffffffffffff78);
  }
  else {
    std::
    unique_ptr<draco::PredictionSchemeDecoder<int,draco::PredictionSchemeWrapDecodingTransform<int,int>>,std::default_delete<draco::PredictionSchemeDecoder<int,draco::PredictionSchemeWrapDecodingTransform<int,int>>>>
    ::
    unique_ptr<std::default_delete<draco::PredictionSchemeDecoder<int,draco::PredictionSchemeWrapDecodingTransform<int,int>>>,void>
              ((unique_ptr<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>_>_>
                *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  return (__uniq_ptr_data<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>_>,_true,_true>
          )(__uniq_ptr_data<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>_>,_true,_true>
            )in_RDI._M_head_impl;
}

Assistant:

std::unique_ptr<PredictionSchemeDecoder<DataTypeT, TransformT>> operator()(
        PredictionSchemeMethod method, const PointAttribute *attribute,
        const TransformT &transform, const MeshDataT &mesh_data,
        uint16_t bitstream_version) {
      if (method == MESH_PREDICTION_PARALLELOGRAM) {
        return std::unique_ptr<PredictionSchemeDecoder<DataTypeT, TransformT>>(
            new MeshPredictionSchemeParallelogramDecoder<DataTypeT, TransformT,
                                                         MeshDataT>(
                attribute, transform, mesh_data));
      }
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
      else if (method == MESH_PREDICTION_MULTI_PARALLELOGRAM) {
        return std::unique_ptr<PredictionSchemeDecoder<DataTypeT, TransformT>>(
            new MeshPredictionSchemeMultiParallelogramDecoder<
                DataTypeT, TransformT, MeshDataT>(attribute, transform,
                                                  mesh_data));
      }
#endif
      else if (method == MESH_PREDICTION_CONSTRAINED_MULTI_PARALLELOGRAM) {
        return std::unique_ptr<PredictionSchemeDecoder<DataTypeT, TransformT>>(
            new MeshPredictionSchemeConstrainedMultiParallelogramDecoder<
                DataTypeT, TransformT, MeshDataT>(attribute, transform,
                                                  mesh_data));
      }
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
      else if (method == MESH_PREDICTION_TEX_COORDS_DEPRECATED) {
        return std::unique_ptr<PredictionSchemeDecoder<DataTypeT, TransformT>>(
            new MeshPredictionSchemeTexCoordsDecoder<DataTypeT, TransformT,
                                                     MeshDataT>(
                attribute, transform, mesh_data, bitstream_version));
      }
#endif
      else if (method == MESH_PREDICTION_TEX_COORDS_PORTABLE) {
        return std::unique_ptr<PredictionSchemeDecoder<DataTypeT, TransformT>>(
            new MeshPredictionSchemeTexCoordsPortableDecoder<
                DataTypeT, TransformT, MeshDataT>(attribute, transform,
                                                  mesh_data));
      }
#ifdef DRACO_NORMAL_ENCODING_SUPPORTED
      else if (method == MESH_PREDICTION_GEOMETRIC_NORMAL) {
        return std::unique_ptr<PredictionSchemeDecoder<DataTypeT, TransformT>>(
            new MeshPredictionSchemeGeometricNormalDecoder<
                DataTypeT, TransformT, MeshDataT>(attribute, transform,
                                                  mesh_data));
      }
#endif
      return nullptr;
    }